

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O1

int64_t eval2(C_Parser *parser,C_Node *node,char ***label)

{
  char cVar1;
  int iVar2;
  C_Type *pCVar3;
  _Bool _Var4;
  uint uVar5;
  int64_t iVar6;
  ulong uVar7;
  int64_t iVar8;
  uint uVar9;
  char *fmt;
  long lVar10;
  C_Token *tok;
  ulong uVar11;
  bool bVar12;
  double dVar13;
  
  lVar10 = 0;
LAB_00127037:
  C_add_type(parser,node);
  _Var4 = C_is_flonum(node->ty);
  if (_Var4) {
    dVar13 = eval_double(parser,node);
    uVar11 = (ulong)dVar13;
LAB_0012752a:
    return lVar10 + uVar11;
  }
  switch(node->kind) {
  case ND_ADD:
    iVar6 = eval2(parser,node->lhs,label);
    node = node->rhs;
    lVar10 = lVar10 + iVar6;
    label = (char ***)0x0;
    goto LAB_00127037;
  case ND_SUB:
    iVar6 = eval2(parser,node->lhs,label);
    iVar8 = eval2(parser,node->rhs,(char ***)0x0);
    uVar11 = iVar6 - iVar8;
    goto LAB_0012752a;
  case ND_MUL:
    iVar6 = eval2(parser,node->lhs,(char ***)0x0);
    iVar8 = eval2(parser,node->rhs,(char ***)0x0);
    uVar11 = iVar8 * iVar6;
    break;
  case ND_DIV:
    _Var4 = node->ty->is_unsigned;
    uVar11 = eval2(parser,node->lhs,(char ***)0x0);
    uVar7 = eval2(parser,node->rhs,(char ***)0x0);
    if (_Var4 == true) {
      uVar11 = uVar11 / uVar7;
    }
    else {
      uVar11 = (long)uVar11 / (long)uVar7;
    }
    goto LAB_0012752a;
  case ND_NEG:
    iVar6 = eval2(parser,node->lhs,(char ***)0x0);
    return lVar10 - iVar6;
  case ND_MOD:
    _Var4 = node->ty->is_unsigned;
    uVar11 = eval2(parser,node->lhs,(char ***)0x0);
    uVar7 = eval2(parser,node->rhs,(char ***)0x0);
    if (_Var4 == true) {
      uVar11 = uVar11 % uVar7;
    }
    else {
      uVar11 = (long)uVar11 % (long)uVar7;
    }
    goto LAB_0012752a;
  case ND_BITAND:
    uVar7 = eval2(parser,node->lhs,(char ***)0x0);
    uVar11 = eval2(parser,node->rhs,(char ***)0x0);
    uVar11 = uVar11 & uVar7;
    break;
  case ND_BITOR:
    uVar7 = eval2(parser,node->lhs,(char ***)0x0);
    uVar11 = eval2(parser,node->rhs,(char ***)0x0);
    uVar11 = uVar11 | uVar7;
    break;
  case ND_BITXOR:
    uVar7 = eval2(parser,node->lhs,(char ***)0x0);
    uVar11 = eval2(parser,node->rhs,(char ***)0x0);
    uVar11 = uVar11 ^ uVar7;
    break;
  case ND_SHL:
    iVar6 = eval2(parser,node->lhs,(char ***)0x0);
    iVar8 = eval2(parser,node->rhs,(char ***)0x0);
    uVar11 = iVar6 << ((byte)iVar8 & 0x3f);
    goto LAB_0012752a;
  case ND_SHR:
    if ((node->ty->is_unsigned == true) && (node->ty->size == 8)) {
      uVar11 = eval2(parser,node->lhs,(char ***)0x0);
      iVar6 = eval2(parser,node->rhs,(char ***)0x0);
      uVar11 = uVar11 >> ((byte)iVar6 & 0x3f);
    }
    else {
      iVar6 = eval2(parser,node->lhs,(char ***)0x0);
      iVar8 = eval2(parser,node->rhs,(char ***)0x0);
      uVar11 = iVar6 >> ((byte)iVar8 & 0x3f);
    }
    goto LAB_0012752a;
  case ND_EQ:
    iVar6 = eval2(parser,node->lhs,(char ***)0x0);
    iVar8 = eval2(parser,node->rhs,(char ***)0x0);
    bVar12 = iVar6 == iVar8;
    goto LAB_00127424;
  case ND_NE:
    iVar6 = eval2(parser,node->lhs,(char ***)0x0);
    iVar8 = eval2(parser,node->rhs,(char ***)0x0);
    bVar12 = iVar6 != iVar8;
LAB_00127424:
    return lVar10 + (ulong)bVar12;
  case ND_LT:
    _Var4 = node->lhs->ty->is_unsigned;
    uVar11 = eval2(parser,node->lhs,(char ***)0x0);
    uVar7 = eval2(parser,node->rhs,(char ***)0x0);
    if (_Var4 == true) {
      uVar11 = (ulong)(uVar11 < uVar7);
    }
    else {
      uVar11 = (ulong)((long)uVar11 < (long)uVar7);
    }
    goto LAB_0012752a;
  case ND_LE:
    _Var4 = node->lhs->ty->is_unsigned;
    uVar11 = eval2(parser,node->lhs,(char ***)0x0);
    uVar7 = eval2(parser,node->rhs,(char ***)0x0);
    if (_Var4 == true) {
      uVar11 = (ulong)(uVar11 <= uVar7);
    }
    else {
      uVar11 = (ulong)((long)uVar11 <= (long)uVar7);
    }
    goto LAB_0012752a;
  default:
    goto switchD_00127065_caseD_10;
  case ND_COND:
    iVar6 = eval2(parser,node->cond,(char ***)0x0);
    if (iVar6 == 0) {
      node = node->els;
    }
    else {
      node = node->then;
    }
    goto LAB_00127037;
  case ND_COMMA:
    goto switchD_00127065_caseD_12;
  case ND_MEMBER:
    if (label == (char ***)0x0) goto switchD_00127065_caseD_10;
    if (node->ty->kind != TY_ARRAY) {
LAB_00127554:
      tok = node->tok;
      fmt = "invalid initializer";
      goto LAB_0012754a;
    }
    iVar6 = eval_rval(parser,node->lhs,label);
    uVar11 = node->member->offset + iVar6;
    goto LAB_0012752a;
  case ND_ADDR:
    uVar11 = eval_rval(parser,node->lhs,label);
    goto LAB_0012752a;
  case ND_NOT:
    iVar6 = eval2(parser,node->lhs,(char ***)0x0);
    return lVar10 + (ulong)(iVar6 == 0);
  case ND_BITNOT:
    uVar11 = eval2(parser,node->lhs,(char ***)0x0);
    uVar11 = ~uVar11;
    break;
  case ND_LOGAND:
    uVar11 = 0;
    iVar6 = eval2(parser,node->lhs,(char ***)0x0);
    if (iVar6 != 0) goto LAB_001274b0;
    goto LAB_0012752a;
  case ND_LOGOR:
    iVar6 = eval2(parser,node->lhs,(char ***)0x0);
    uVar11 = 1;
    if (iVar6 == 0) {
LAB_001274b0:
      iVar6 = eval2(parser,node->rhs,(char ***)0x0);
      return (lVar10 + 1) - (ulong)(iVar6 == 0);
    }
    goto LAB_0012752a;
  case ND_LABEL_VAL:
    *label = &node->unique_label;
LAB_00127492:
    uVar11 = 0;
    goto LAB_0012752a;
  case ND_VAR:
    if (label != (char ***)0x0) {
      if (1 < node->var->ty->kind - TY_FUNC) goto LAB_00127554;
      *label = &node->var->name;
      goto LAB_00127492;
    }
switchD_00127065_caseD_10:
    tok = node->tok;
    fmt = "not a compile-time constant";
LAB_0012754a:
    C_error_tok(parser,tok,fmt);
  case ND_NUM:
    uVar11 = node->val;
    goto LAB_0012752a;
  case ND_CAST:
    uVar11 = eval2(parser,node->lhs,label);
    _Var4 = C_is_integer(node->ty);
    if (!_Var4) goto LAB_0012752a;
    pCVar3 = node->ty;
    iVar2 = pCVar3->size;
    if (iVar2 == 4) {
      uVar11 = uVar11 & 0xffffffff;
      goto LAB_0012752a;
    }
    if (iVar2 == 2) {
      uVar9 = (uint)uVar11 & 0xffff;
      cVar1 = pCVar3->is_unsigned;
      uVar5 = (uint)(short)uVar11;
    }
    else {
      if (iVar2 != 1) goto LAB_0012752a;
      uVar9 = (uint)uVar11 & 0xff;
      cVar1 = pCVar3->is_unsigned;
      uVar5 = (uint)(char)uVar11;
    }
    if (cVar1 != '\0') {
      uVar5 = uVar9;
    }
    uVar11 = (ulong)(int)uVar5;
    goto LAB_0012752a;
  }
  return lVar10 + uVar11;
switchD_00127065_caseD_12:
  node = node->rhs;
  goto LAB_00127037;
}

Assistant:

static int64_t eval2(C_Parser *parser, C_Node *node, char ***label) {
  C_add_type(parser, node);

  if (C_is_flonum(node->ty))
    return eval_double(parser, node);

  switch (node->kind) {
  case ND_ADD:
    return eval2(parser, node->lhs, label) + eval(parser, node->rhs);
  case ND_SUB:
    return eval2(parser, node->lhs, label) - eval(parser, node->rhs);
  case ND_MUL:
    return eval(parser, node->lhs) * eval(parser, node->rhs);
  case ND_DIV:
    if (node->ty->is_unsigned)
      return (uint64_t)eval(parser, node->lhs) / eval(parser, node->rhs);
    return eval(parser, node->lhs) / eval(parser, node->rhs);
  case ND_NEG:
    return -eval(parser, node->lhs);
  case ND_MOD:
    if (node->ty->is_unsigned)
      return (uint64_t)eval(parser, node->lhs) % eval(parser, node->rhs);
    return eval(parser, node->lhs) % eval(parser, node->rhs);
  case ND_BITAND:
    return eval(parser, node->lhs) & eval(parser, node->rhs);
  case ND_BITOR:
    return eval(parser, node->lhs) | eval(parser, node->rhs);
  case ND_BITXOR:
    return eval(parser, node->lhs) ^ eval(parser, node->rhs);
  case ND_SHL:
    return eval(parser, node->lhs) << eval(parser, node->rhs);
  case ND_SHR:
    if (node->ty->is_unsigned && node->ty->size == 8)
      return (uint64_t)eval(parser, node->lhs) >> eval(parser, node->rhs);
    return eval(parser, node->lhs) >> eval(parser, node->rhs);
  case ND_EQ:
    return eval(parser, node->lhs) == eval(parser, node->rhs);
  case ND_NE:
    return eval(parser, node->lhs) != eval(parser, node->rhs);
  case ND_LT:
    if (node->lhs->ty->is_unsigned)
      return (uint64_t)eval(parser, node->lhs) < eval(parser, node->rhs);
    return eval(parser, node->lhs) < eval(parser, node->rhs);
  case ND_LE:
    if (node->lhs->ty->is_unsigned)
      return (uint64_t)eval(parser, node->lhs) <= eval(parser, node->rhs);
    return eval(parser, node->lhs) <= eval(parser, node->rhs);
  case ND_COND:
    return eval(parser, node->cond) ? eval2(parser, node->then, label) : eval2(parser, node->els, label);
  case ND_COMMA:
    return eval2(parser, node->rhs, label);
  case ND_NOT:
    return !eval(parser, node->lhs);
  case ND_BITNOT:
    return ~eval(parser, node->lhs);
  case ND_LOGAND:
    return eval(parser, node->lhs) && eval(parser, node->rhs);
  case ND_LOGOR:
    return eval(parser, node->lhs) || eval(parser, node->rhs);
  case ND_CAST: {
    int64_t val = eval2(parser, node->lhs, label);
    if (C_is_integer(node->ty)) {
      switch (node->ty->size) {
      case 1: return node->ty->is_unsigned ? (uint8_t)val : (int8_t)val;
      case 2: return node->ty->is_unsigned ? (uint16_t)val : (int16_t)val;
      case 4: return node->ty->is_unsigned ? (uint32_t)val : (int32_t)val;
      }
    }
    return val;
  }
  case ND_ADDR:
    return eval_rval(parser, node->lhs, label);
  case ND_LABEL_VAL:
    *label = &node->unique_label;
    return 0;
  case ND_MEMBER:
    if (!label)
      C_error_tok(parser, node->tok, "not a compile-time constant");
    if (node->ty->kind != TY_ARRAY)
      C_error_tok(parser, node->tok, "invalid initializer");
    return eval_rval(parser, node->lhs, label) + node->member->offset;
  case ND_VAR:
    if (!label)
      C_error_tok(parser, node->tok, "not a compile-time constant");
    if (node->var->ty->kind != TY_ARRAY && node->var->ty->kind != TY_FUNC)
      C_error_tok(parser, node->tok, "invalid initializer");
    *label = &node->var->name;
    return 0;
  case ND_NUM:
    return node->val;
  default:
    break;
  }

  C_error_tok(parser, node->tok, "not a compile-time constant");
  return 0; // not reached
}